

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>
               (int *dummy)

{
  bool OK;
  anon_class_8_1_3fcf629a local_40;
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1> local_38;
  
  OK = true;
  local_38.ptr = 0;
  local_38.allocptr = 0;
  local_40.OK = (bool *)&local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x94,(anon_class_8_1_4513f532 *)&local_40,
             "!optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_dereferencable_ptr
            (&local_38);
  OK = false;
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_2_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x96,&local_40,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_ptr(&local_38);
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x98,&local_40,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::init
            (&local_38,(EVP_PKEY_CTX *)dummy);
  local_40.OK = (bool *)&local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_4_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x9e,(anon_class_8_1_4513f532 *)&local_40,
             "!optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_dereferencable_ptr
            (&local_38);
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_5_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa0,&local_40,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_ptr(&local_38);
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_6_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa2,&local_40,"OK");
  local_38.ptr = 8;
  local_40.OK = (bool *)&local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_7_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa5,(anon_class_8_1_4513f532 *)&local_40,
             "optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_ptr(&local_38);
  OK = false;
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_8_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa7,&local_40,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_dereferencable_ptr
            (&local_38);
  OK = false;
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_9_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa9,&local_40,"OK");
  local_40.OK = (bool *)&local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_10_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xad,(anon_class_8_1_4513f532 *)&local_40,
             "optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::get_allocated_ptr(&local_38);
  OK = false;
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_11_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xaf,&local_40,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3UL,_32,_1>::
  get_dereferencable_allocated_ptr(&local_38);
  OK = false;
  local_40.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::optimized_allocated_ptr_and_ptr_and_data_and_flags_64_<3ul,32,1>,true>(int*)::_lambda()_12_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xb1,&local_40,"OK");
  return;
}

Assistant:

void testPtrStructsWithZombieProperty_(int* dummy)
{
	bool OK = true;
	TestStructT optimizedPtrWithZombiePproperty;

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init();
	else
		optimizedPtrWithZombiePproperty.init(nullptr);

	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init(dummy, dummy, 17);
	else
		optimizedPtrWithZombiePproperty.init(dummy);
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	optimizedPtrWithZombiePproperty.set_zombie();
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
	{
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
		try { optimizedPtrWithZombiePproperty.get_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
		try { optimizedPtrWithZombiePproperty.get_dereferencable_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	}
}